

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_Copy_Test::testBody(TEST_SimpleString_Copy_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString s2;
  SimpleString s1;
  TEST_SimpleString_Copy_Test *this_local;
  
  SimpleString::SimpleString((SimpleString *)&s2.bufferSize_,"hello");
  SimpleString::SimpleString((SimpleString *)local_30,(SimpleString *)&s2.bufferSize_);
  bVar1 = operator!=((SimpleString *)&s2.bufferSize_,(SimpleString *)local_30);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)local_30,(SimpleString *)local_30);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xdd);
    }
    bVar1 = operator!=((SimpleString *)&s2.bufferSize_,(SimpleString *)&s2.bufferSize_);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0xdd);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(local_50);
    pcVar2 = SimpleString::asCharString(local_50);
    StringFrom(&local_60);
    pcVar3 = SimpleString::asCharString(&local_60);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xdd,pTVar5);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString(local_50);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0xdd,pTVar5);
  }
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&s2.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, Copy)
{
    SimpleString s1("hello");
    SimpleString s2(s1);

    CHECK_EQUAL(s1, s2);
}